

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

void graph_copy_init_tensor
               (ggml_hash_set *hash_set,ggml_tensor **node_copies,_Bool *node_init,ggml_tensor *src)

{
  ggml_status gVar1;
  ggml_tensor *src_00;
  _Bool *in_RCX;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *s;
  int i;
  ggml_status status;
  ggml_tensor *dst;
  size_t id;
  int local_38;
  ggml_tensor *in_stack_ffffffffffffffd0;
  ggml_hash_set *in_stack_ffffffffffffffd8;
  
  src_00 = (ggml_tensor *)ggml_hash_find(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if ((*(byte *)((long)src_00->ne + (long)(in_RDX->ne + -4)) & 1) == 0) {
    *(undefined1 *)((long)src_00->ne + (long)(in_RDX->ne + -4)) = 1;
    if (*(long *)(in_RSI->ne[(long)(src_00[-1].padding + 6)] + 0xe8) == 0) {
      ggml_backend_tensor_copy(in_RSI,in_RDX);
    }
    else {
      graph_copy_init_tensor((ggml_hash_set *)in_RSI,(ggml_tensor **)in_RDX,in_RCX,src_00);
      gVar1 = ggml_backend_view_init((ggml_tensor *)0x16383b);
      if (gVar1 != GGML_STATUS_SUCCESS) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
                   ,0x6b2,"GGML_ASSERT(%s) failed","status == GGML_STATUS_SUCCESS");
      }
    }
    for (local_38 = 0; local_38 < 10; local_38 = local_38 + 1) {
      if (*(long *)(in_RCX + (long)local_38 * 8 + 0x98) != 0) {
        graph_copy_init_tensor((ggml_hash_set *)in_RSI,(ggml_tensor **)in_RDX,in_RCX,src_00);
      }
    }
  }
  return;
}

Assistant:

static void graph_copy_init_tensor(struct ggml_hash_set * hash_set, struct ggml_tensor ** node_copies, bool * node_init, struct ggml_tensor * src) {
    size_t id = ggml_hash_find(hash_set, src);
    if (node_init[id]) {
        return;
    }
    node_init[id] = true;

    struct ggml_tensor * dst = node_copies[id];
    if (dst->view_src != NULL) {
        graph_copy_init_tensor(hash_set, node_copies, node_init, src->view_src);
        enum ggml_status status = ggml_backend_view_init(dst);
        GGML_ASSERT(status == GGML_STATUS_SUCCESS);
    }
    else {
        ggml_backend_tensor_copy(src, dst);
    }

    // init src
    for (int i = 0; i < GGML_MAX_SRC; i++) {
        struct ggml_tensor * s = src->src[i];
        if (s == NULL) {
            continue;
        }
        graph_copy_init_tensor(hash_set, node_copies, node_init, s);
    }
}